

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> * __thiscall
fmt::v8::make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_char&>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
           *__return_storage_ptr__,v8 *this,uchar *args)

{
  uchar *args_local;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> *local_48;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  uint *arg;
  
  local_48._0_4_ = (uint)(__return_storage_ptr__->data_).args_[0].field_0.bool_value;
  return local_48;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}